

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall asmjit::v1_14::BaseEmitter::setLogger(BaseEmitter *this,Logger *logger)

{
  BaseEmitter *in_RSI;
  long in_RDI;
  
  if (in_RSI == (BaseEmitter *)0x0) {
    *(undefined8 *)(in_RDI + 0x38) = 0;
    *(byte *)(in_RDI + 9) = *(byte *)(in_RDI + 9) & *(byte *)(in_RDI + 9) & 0xef;
    if (*(long *)(in_RDI + 0x30) != 0) {
      *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(*(long *)(in_RDI + 0x30) + 0x30);
    }
  }
  else {
    *(BaseEmitter **)(in_RDI + 0x38) = in_RSI;
    *(byte *)(in_RDI + 9) = *(byte *)(in_RDI + 9) | 0x10;
  }
  BaseEmitter_updateForcedOptions(in_RSI);
  return;
}

Assistant:

void BaseEmitter::setLogger(Logger* logger) noexcept {
#ifndef ASMJIT_NO_LOGGING
  if (logger) {
    _logger = logger;
    _addEmitterFlags(EmitterFlags::kOwnLogger);
  }
  else {
    _logger = nullptr;
    _clearEmitterFlags(EmitterFlags::kOwnLogger);
    if (_code)
      _logger = _code->logger();
  }
  BaseEmitter_updateForcedOptions(this);
#else
  DebugUtils::unused(logger);
#endif
}